

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

bool doctest::detail::parseFlagImpl(int argc,char **argv,char *pattern)

{
  char *pcVar1;
  char *__haystack;
  char *in;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)argc;
  do {
    do {
      do {
        iVar4 = (int)uVar5;
        if (iVar4 < 1) {
LAB_001044b3:
          return 0 < iVar4;
        }
        __haystack = argv[uVar5 - 1];
        uVar5 = uVar5 - 1;
        in = strstr(__haystack,pattern);
      } while (in == (char *)0x0);
      sVar2 = my_strlen(in);
      sVar3 = my_strlen(pattern);
    } while (sVar2 != sVar3);
    do {
      if (in == __haystack) {
        if (*__haystack == '-') goto LAB_001044b3;
        break;
      }
      pcVar1 = in + -1;
      in = in + -1;
    } while (*pcVar1 == '-');
  } while( true );
}

Assistant:

bool parseFlagImpl(int argc, const char* const* argv, const char* pattern) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp && my_strlen(temp) == my_strlen(pattern)) {
                // eliminate strings in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                while(temp != argv[i]) {
                    if(*--temp != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-')
                    return true;
            }
        }
        return false;
    }